

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyrsa.cpp
# Opt level: O0

void Base64Encode(uchar *buffer,size_t length,char **base64Text)

{
  BIO_METHOD *pBVar1;
  long local_38;
  BUF_MEM *bufferPtr;
  BIO *b64;
  BIO *bio;
  char **base64Text_local;
  size_t length_local;
  uchar *buffer_local;
  
  bio = (BIO *)base64Text;
  base64Text_local = (char **)length;
  length_local = (size_t)buffer;
  pBVar1 = BIO_f_base64();
  bufferPtr = (BUF_MEM *)BIO_new(pBVar1);
  pBVar1 = BIO_s_mem();
  b64 = (BIO *)BIO_new(pBVar1);
  b64 = (BIO *)BIO_push((BIO *)bufferPtr,(BIO *)b64);
  BIO_write((BIO *)b64,(void *)length_local,(int)base64Text_local);
  BIO_ctrl((BIO *)b64,0xb,0,(void *)0x0);
  BIO_ctrl((BIO *)b64,0x73,0,&local_38);
  BIO_ctrl((BIO *)b64,9,0,(void *)0x0);
  BIO_free_all((BIO *)b64);
  *(undefined8 *)bio = *(undefined8 *)(local_38 + 8);
  return;
}

Assistant:

void Base64Encode( const unsigned char* buffer,
                   size_t length,
                   char** base64Text) {
  BIO *bio, *b64;
  BUF_MEM *bufferPtr;

  b64 = BIO_new(BIO_f_base64());
  bio = BIO_new(BIO_s_mem());
  bio = BIO_push(b64, bio);

  BIO_write(bio, buffer, static_cast<int>(length));
  BIO_flush(bio);
  BIO_get_mem_ptr(bio, &bufferPtr);
  BIO_set_close(bio, BIO_NOCLOSE);
  BIO_free_all(bio);

  *base64Text=(*bufferPtr).data;
}